

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv_udp_set_source_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,char *source_addr,
              uv_membership membership)

{
  undefined1 local_70 [8];
  uv__sockaddr src_addr;
  uv__sockaddr mcast_addr;
  int err;
  uv_membership membership_local;
  char *source_addr_local;
  char *interface_addr_local;
  char *multicast_addr_local;
  uv_udp_t *handle_local;
  
  mcast_addr.in6.sin6_scope_id = membership;
  _err = source_addr;
  source_addr_local = interface_addr;
  interface_addr_local = multicast_addr;
  multicast_addr_local = (char *)handle;
  mcast_addr._20_4_ =
       uv_ip4_addr(multicast_addr,0,(sockaddr_in *)((long)&src_addr.in6.sin6_addr.__in6_u + 0xc));
  if (mcast_addr._20_4_ == 0) {
    mcast_addr._20_4_ = uv_ip4_addr(_err,0,(sockaddr_in *)local_70);
    handle_local._4_4_ = mcast_addr._20_4_;
    if (mcast_addr._20_4_ == 0) {
      handle_local._4_4_ =
           uv__udp_set_source_membership4
                     ((uv_udp_t *)multicast_addr_local,
                      (sockaddr_in *)((long)&src_addr.in6.sin6_addr.__in6_u + 0xc),source_addr_local
                      ,(sockaddr_in *)local_70,mcast_addr.in6.sin6_scope_id);
    }
  }
  else {
    mcast_addr._20_4_ =
         uv_ip6_addr(interface_addr_local,0,
                     (sockaddr_in6 *)((long)&src_addr.in6.sin6_addr.__in6_u + 0xc));
    handle_local._4_4_ = mcast_addr._20_4_;
    if ((mcast_addr._20_4_ == 0) &&
       (mcast_addr._20_4_ = uv_ip6_addr(_err,0,(sockaddr_in6 *)local_70),
       handle_local._4_4_ = mcast_addr._20_4_, mcast_addr._20_4_ == 0)) {
      handle_local._4_4_ =
           uv__udp_set_source_membership6
                     ((uv_udp_t *)multicast_addr_local,
                      (sockaddr_in6 *)((long)&src_addr.in6.sin6_addr.__in6_u + 0xc),
                      source_addr_local,(sockaddr_in6 *)local_70,mcast_addr.in6.sin6_scope_id);
    }
  }
  return handle_local._4_4_;
}

Assistant:

int uv_udp_set_source_membership(uv_udp_t* handle,
                                 const char* multicast_addr,
                                 const char* interface_addr,
                                 const char* source_addr,
                                 uv_membership membership) {
#if !defined(__OpenBSD__) &&                                        \
    !defined(__NetBSD__) &&                                         \
    !defined(__ANDROID__) &&                                        \
    !defined(__DragonFly__) &&                                      \
    !defined(__QNX__) &&                                            \
    !defined(__GNU__)
  int err;
  union uv__sockaddr mcast_addr;
  union uv__sockaddr src_addr;

  err = uv_ip4_addr(multicast_addr, 0, &mcast_addr.in);
  if (err) {
    err = uv_ip6_addr(multicast_addr, 0, &mcast_addr.in6);
    if (err)
      return err;
    err = uv_ip6_addr(source_addr, 0, &src_addr.in6);
    if (err)
      return err;
    return uv__udp_set_source_membership6(handle,
                                          &mcast_addr.in6,
                                          interface_addr,
                                          &src_addr.in6,
                                          membership);
  }

  err = uv_ip4_addr(source_addr, 0, &src_addr.in);
  if (err)
    return err;
  return uv__udp_set_source_membership4(handle,
                                        &mcast_addr.in,
                                        interface_addr,
                                        &src_addr.in,
                                        membership);
#else
  return UV_ENOSYS;
#endif
}